

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexDeclaration
          (OgreBinarySerializer *this,VertexData *dest)

{
  StreamReader<false,_false> *pSVar1;
  unsigned_short uVar2;
  uint uVar3;
  MemoryStreamReader *this_00;
  bool bVar4;
  
  pSVar1 = this->m_reader;
  if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    uVar2 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
    uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar3;
    this_00 = this->m_reader;
    bVar4 = *(int *)&this_00->end == *(int *)&this_00->current;
    if (uVar2 == 0x5110 && !bVar4) {
      do {
        ReadGeometryVertexElement(this,dest);
        pSVar1 = this->m_reader;
        if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
          uVar2 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
          uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar3;
        }
        this_00 = this->m_reader;
        bVar4 = *(int *)&this_00->end == *(int *)&this_00->current;
      } while ((!bVar4) && (uVar2 == 0x5110));
    }
    if (!bVar4) {
      StreamReader<false,_false>::IncPtr(this_00,-6);
      return;
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadGeometryVertexDeclaration(VertexData *dest)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_GEOMETRY_VERTEX_ELEMENT)
        {
            ReadGeometryVertexElement(dest);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}